

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

double __thiscall tinyxml2::XMLElement::DoubleAttribute(XMLElement *this,char *name)

{
  XMLAttribute *this_00;
  double d;
  double local_8;
  
  local_8 = 0.0;
  this_00 = FindAttribute(this,name);
  if (this_00 != (XMLAttribute *)0x0) {
    XMLAttribute::QueryDoubleValue(this_00,&local_8);
  }
  return local_8;
}

Assistant:

double 	 DoubleAttribute( const char* name ) const	{
        double d=0;
        QueryDoubleAttribute( name, &d );
        return d;
    }